

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricProgrammableGetPropertiesExpPrologue
          (ZETHandleLifetimeValidation *this,
          zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_exp_properties_t *pProperties)

{
  bool bVar1;
  pointer this_00;
  zet_metric_programmable_exp_properties_t *pProperties_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  ZETHandleLifetimeValidation *this_local;
  
  this_00 = std::
            unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
            ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                          *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid<_zet_metric_programmable_exp_handle_t*>
                    (this_00,hMetricProgrammable);
  if (bVar1) {
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricProgrammableGetPropertiesExpPrologue(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_exp_properties_t* pProperties   ///< [in,out] properties of the metric programmable
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hMetricProgrammable )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }